

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  Context *context;
  EnumValueDescriptor *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Descriptor *descriptor;
  ulong uVar5;
  bool bVar6;
  mapped_type *pmVar7;
  long lVar8;
  pointer ppEVar9;
  EnumDescriptor *pEVar10;
  pointer ppEVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  EnumGenerator *pEVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  Printer *pPVar19;
  size_t sVar20;
  key_type local_110;
  undefined1 local_f0 [8];
  string index_text;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_78;
  Printer *local_48;
  undefined4 local_3c;
  EnumGenerator *local_38;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar10 = this->descriptor_;
  bVar6 = this->immutable_api_;
  p_Var1 = &vars._M_t._M_impl.super__Rb_tree_header;
  local_b0 = (undefined1  [8])p_Var1;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar10,bVar6,(string *)local_b0);
  if (local_b0 != (undefined1  [8])p_Var1) {
    operator_delete((void *)local_b0);
  }
  pEVar17 = local_38;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public enum $classname$\n    implements com.google.protobuf.ProtocolMessageEnum {\n",
             (char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              local_38->descriptor_);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (printer,"classname","classname",pEVar17->descriptor_);
  google::protobuf::io::Printer::Indent();
  local_f0 = (undefined1  [8])&index_text._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"ordinal()","");
  ppEVar9 = (pEVar17->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = (pEVar17->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)ppEVar11 - (long)ppEVar9;
  local_48 = printer;
  if (lVar13 == 0) {
    local_3c = 1;
  }
  else {
    uVar14 = lVar13 >> 3;
    if ((int)((ulong)((long)*ppEVar9 - *(long *)(*(long *)(*ppEVar9 + 0x18) + 0x30)) >> 3) *
        -0x33333333 == 0) {
      uVar5 = 1;
      do {
        uVar16 = uVar5;
        if (uVar14 + (uVar14 == 0) == uVar16) {
          local_3c = (undefined4)CONCAT71((int7)(lVar13 >> 0xb),uVar14 <= uVar16);
          goto LAB_002054de;
        }
        uVar5 = uVar16 + 1;
      } while (uVar16 == (uint)((int)((ulong)((long)ppEVar9[uVar16] -
                                             *(long *)(*(long *)(ppEVar9[uVar16] + 0x18) + 0x30)) >>
                                     3) * -0x33333333));
      local_3c = (undefined4)CONCAT71((int7)((ulong)ppEVar9 >> 8),uVar14 <= uVar16);
    }
    else {
      local_3c = 0;
    }
    std::__cxx11::string::_M_replace((ulong)local_f0,0,index_text._M_dataplus._M_p,0x290fa5);
    ppEVar9 = (local_38->canonical_values_).
              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar11 = (local_38->canonical_values_).
               super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_002054de:
  if (ppEVar11 != ppEVar9) {
    paVar18 = &local_78.field_2;
    uVar14 = 0;
    do {
      vars._M_t._M_impl._0_8_ = vars._M_t._M_impl._0_8_ & 0xffffffff00000000;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = uVar14;
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pEVar3 = (local_38->canonical_values_).
               super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start
               [vars._M_t._M_impl.super__Rb_tree_header._M_node_count];
      local_78._M_dataplus._M_p = (pointer)paVar18;
      lVar13 = google::protobuf::FastInt32ToBufferLeft
                         ((int)((ulong)((long)pEVar3 - *(long *)(*(long *)(pEVar3 + 0x18) + 0x30))
                               >> 3) * -0x33333333,paVar18->_M_local_buf);
      psVar2 = (string *)(index_text.field_2._M_local_buf + 8);
      local_78._M_string_length = lVar13 - (long)paVar18;
      index_text.field_2._8_8_ = &stack0xffffffffffffff40;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar2,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"index","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_110);
      std::__cxx11::string::operator=((string *)pmVar7,psVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((undefined1 *)index_text.field_2._8_8_ != &stack0xffffffffffffff40) {
        operator_delete((void *)index_text.field_2._8_8_);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      lVar13 = google::protobuf::FastInt32ToBufferLeft
                         (*(int *)((local_38->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [vars._M_t._M_impl.super__Rb_tree_header._M_node_count] + 0x10),
                          paVar18->_M_local_buf);
      local_78._M_string_length = lVar13 - (long)paVar18;
      index_text.field_2._8_8_ = &stack0xffffffffffffff40;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar2,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"number","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_110);
      std::__cxx11::string::operator=((string *)pmVar7,psVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      sVar20 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((undefined1 *)index_text.field_2._8_8_ != &stack0xffffffffffffff40) {
        operator_delete((void *)index_text.field_2._8_8_);
      }
      WriteEnumValueDocComment
                (local_48,(local_38->canonical_values_).
                          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar20]);
      if (*(char *)(*(long *)((local_38->canonical_values_).
                              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar20] + 0x20) + 0x48) ==
          '\x01') {
        io::Printer::Print<>(local_48,"@java.lang.Deprecated\n");
      }
      google::protobuf::io::Printer::Print((map *)local_48,(char *)local_b0);
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (local_48,"name","name",
                 (local_38->canonical_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar20]);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
      uVar14 = sVar20 + 1;
    } while (uVar14 < (ulong)((long)(local_38->canonical_values_).
                                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_38->canonical_values_).
                                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pEVar17 = local_38;
  pPVar19 = local_48;
  if (*(int *)(*(long *)(local_38->descriptor_ + 0x10) + 0x3c) == 3) {
    pcVar15 = "${$UNRECOGNIZED$}$(-1, -1),\n";
    if ((char)local_3c != '\0') {
      pcVar15 = "${$UNRECOGNIZED$}$(-1),\n";
    }
    io::Printer::Print<char[2],char[1],char[2],char[1]>
              (local_48,pcVar15,(char (*) [2])0x28cbed,(char (*) [1])0x286495,(char (*) [2])0x2bd6b5
               ,(char (*) [1])0x286495);
    io::Printer::Annotate<google::protobuf::EnumDescriptor>(pPVar19,"{","}",pEVar17->descriptor_);
  }
  io::Printer::Print<>(pPVar19,";\n\n");
  if ((pEVar17->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pEVar17->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      vars._M_t._M_impl._0_8_ = vars._M_t._M_impl._0_8_ & 0xffffffff00000000;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      paVar18 = &local_78.field_2;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"classname","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"canonical_name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pPVar19 = local_48;
      WriteEnumValueDocComment
                (local_48,*(EnumValueDescriptor **)
                           ((long)&((local_38->aliases_).
                                    super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->value + lVar13));
      google::protobuf::io::Printer::Print((map *)pPVar19,local_b0);
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (pPVar19,"name","name",
                 *(EnumValueDescriptor **)
                  ((long)&((local_38->aliases_).
                           super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                           ._M_impl.super__Vector_impl_data._M_start)->value + lVar13));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
      pEVar17 = local_38;
    } while (uVar14 < (ulong)((long)(local_38->aliases_).
                                    super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_38->aliases_).
                                    super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (0 < *(int *)(pEVar17->descriptor_ + 0x2c)) {
    sVar20 = 0;
    lVar13 = 0;
    do {
      paVar18 = &local_78.field_2;
      vars._M_t._M_impl._0_8_ = vars._M_t._M_impl._0_8_ & 0xffffffff00000000;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar20;
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      lVar8 = google::protobuf::FastInt32ToBufferLeft
                        (*(int *)(*(long *)(local_38->descriptor_ + 0x30) + 0x10 +
                                 vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
                         paVar18->_M_local_buf);
      local_78._M_string_length = lVar8 - (long)paVar18;
      index_text.field_2._8_8_ = &stack0xffffffffffffff40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&index_text.field_2 + 8),local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"number","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_110);
      std::__cxx11::string::operator=
                ((string *)pmVar7,(string *)(index_text.field_2._M_local_buf + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((undefined1 *)index_text.field_2._8_8_ != &stack0xffffffffffffff40) {
        operator_delete((void *)index_text.field_2._8_8_);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x286495);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar18) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"}","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x286495);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pcVar15 = "";
      if (*(char *)(*(long *)(*(long *)(local_38->descriptor_ + 0x30) + 0x20 +
                             vars._M_t._M_impl.super__Rb_tree_header._M_node_count) + 0x48) != '\0')
      {
        pcVar15 = "@java.lang.Deprecated ";
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"deprecation","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_b0,&local_78);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,(ulong)pcVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pPVar19 = local_48;
      sVar20 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      WriteEnumValueDocComment
                (local_48,(EnumValueDescriptor *)
                          (*(long *)(local_38->descriptor_ + 0x30) +
                          vars._M_t._M_impl.super__Rb_tree_header._M_node_count));
      google::protobuf::io::Printer::Print((map *)pPVar19,(char *)local_b0);
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (pPVar19,"{","}",
                 (EnumValueDescriptor *)(*(long *)(local_38->descriptor_ + 0x30) + sVar20));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
      lVar13 = lVar13 + 1;
      sVar20 = sVar20 + 0x28;
    } while (lVar13 < *(int *)(local_38->descriptor_ + 0x2c));
  }
  pPVar19 = local_48;
  io::Printer::Print<>(local_48,"\n");
  pEVar17 = local_38;
  io::Printer::Print<>(pPVar19,"\npublic final int getNumber() {\n");
  if (*(int *)(*(long *)(pEVar17->descriptor_ + 0x10) + 0x3c) == 3) {
    pcVar15 = 
    "  if (index == -1) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    if ((char)local_3c != '\0') {
      pcVar15 = 
      "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
      ;
    }
    io::Printer::Print<>(pPVar19,pcVar15);
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar19,
             "  return value;\n}\n\n/**\n * @param value The numeric wire value of the corresponding enum entry.\n * @return The enum associated with the given numeric wire value.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\n/**\n * @param value The numeric wire value of the corresponding enum entry.\n * @return The enum associated with the given numeric wire value.\n */\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
             ,(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              pEVar17->descriptor_);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  ppEVar9 = (pEVar17->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pEVar17->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar9) {
    uVar14 = 0;
    do {
      pbVar4 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ppEVar9[uVar14];
      p_Var1 = &vars._M_t._M_impl.super__Rb_tree_header;
      local_b0 = (undefined1  [8])p_Var1;
      lVar13 = google::protobuf::FastInt32ToBufferLeft
                         (*(int *)(ppEVar9[uVar14] + 0x10),(char *)p_Var1);
      vars._M_t._M_impl._0_8_ = lVar13 - (long)p_Var1;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,local_b0,(pointer)((long)local_b0 + vars._M_t._M_impl._0_8_));
      io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (local_48,"case $number$: return $name$;\n",(char (*) [5])0x2d3a42,pbVar4,
                 (char (*) [7])0x2b4513,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar14 = uVar14 + 1;
      ppEVar9 = (local_38->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(local_38->canonical_values_).
                                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar9 >> 3)
            );
  }
  pPVar19 = local_48;
  google::protobuf::io::Printer::Outdent();
  pEVar17 = local_38;
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar19,
             "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
             ,(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              pEVar17->descriptor_);
  if ((pEVar17->context_->options_).enforce_lite != false) goto LAB_002061ec;
  io::Printer::Print<>
            (pPVar19,
             "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n    getValueDescriptor() {\n"
            );
  if (*(int *)(*(long *)(pEVar17->descriptor_ + 0x10) + 0x3c) == 3) {
    pcVar15 = 
    "  if (index == -1) {\n    throw new java.lang.IllegalStateException(\n        \"Can\'t get the descriptor of an unrecognized enum value.\");\n  }\n"
    ;
    if ((char)local_3c != '\0') {
      pcVar15 = 
      "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalStateException(\n        \"Can\'t get the descriptor of an unrecognized enum value.\");\n  }\n"
      ;
    }
    io::Printer::Print<>(pPVar19,pcVar15);
  }
  io::Printer::Print<char[11],std::__cxx11::string>
            (pPVar19,
             "  return getDescriptor().getValues().get($index_text$);\n}\npublic final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\npublic static final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptor() {\n"
             ,(char (*) [11])"index_text",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  descriptor = *(Descriptor **)(pEVar17->descriptor_ + 0x18);
  if (descriptor == (Descriptor *)0x0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_78,pEVar17->name_resolver_,*(FileDescriptor **)(pEVar17->descriptor_ + 0x10),
               pEVar17->immutable_api_);
    p_Var1 = &vars._M_t._M_impl.super__Rb_tree_header;
    pEVar10 = pEVar17->descriptor_;
    plVar12 = (long *)(*(long *)(pEVar10 + 0x10) + 0x70);
    if (*(long *)(pEVar10 + 0x18) != 0) {
      plVar12 = (long *)(*(long *)(pEVar10 + 0x18) + 0x40);
    }
    local_b0 = (undefined1  [8])p_Var1;
    lVar13 = google::protobuf::FastInt32ToBufferLeft
                       ((int)((ulong)((long)pEVar10 - *plVar12) >> 4) * -0x33333333,(char *)p_Var1);
    vars._M_t._M_impl._0_8_ = lVar13 - (long)p_Var1;
    index_text.field_2._8_8_ = &stack0xffffffffffffff40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&index_text.field_2 + 8),local_b0,
               (pointer)((long)local_b0 + vars._M_t._M_impl._0_8_));
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (pPVar19,"  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
               (char (*) [5])0x2c9b5d,&local_78,(char (*) [6])0x290fa5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&index_text.field_2 + 8));
    if ((undefined1 *)index_text.field_2._8_8_ != &stack0xffffffffffffff40) {
      operator_delete((void *)index_text.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_00206089;
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_78,pEVar17->name_resolver_,descriptor,pEVar17->immutable_api_);
    p_Var1 = &vars._M_t._M_impl.super__Rb_tree_header;
    pEVar10 = pEVar17->descriptor_;
    lVar13 = *(long *)(pEVar10 + 0x18);
    local_110._M_dataplus._M_p = "getDescriptor()";
    if (*(char *)(*(long *)(lVar13 + 0x20) + 0x49) != '\0') {
      local_110._M_dataplus._M_p = "getDefaultInstance().getDescriptorForType()";
    }
    plVar12 = (long *)(*(long *)(pEVar10 + 0x10) + 0x70);
    if (lVar13 != 0) {
      plVar12 = (long *)(lVar13 + 0x40);
    }
    local_b0 = (undefined1  [8])p_Var1;
    lVar13 = google::protobuf::FastInt32ToBufferLeft
                       ((int)((ulong)((long)pEVar10 - *plVar12) >> 4) * -0x33333333,(char *)p_Var1);
    vars._M_t._M_impl._0_8_ = lVar13 - (long)p_Var1;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&index_text.field_2 + 8);
    index_text.field_2._8_8_ = &stack0xffffffffffffff40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar4,local_b0,(pointer)((long)local_b0 + vars._M_t._M_impl._0_8_));
    io::Printer::
    Print<char[7],std::__cxx11::string,char[11],char_const*,char[6],std::__cxx11::string>
              (pPVar19,"  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
               (char (*) [7])"parent",&local_78,(char (*) [11])0x2ad6d4,(char **)&local_110,
               (char (*) [6])0x290fa5,pbVar4);
    if ((undefined1 *)index_text.field_2._8_8_ != &stack0xffffffffffffff40) {
      operator_delete((void *)index_text.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00206089:
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar19,"}\n\nprivate static final $classname$[] VALUES = ",(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              pEVar17->descriptor_);
  bVar6 = CanUseEnumValues(pEVar17);
  if (bVar6) {
    pcVar15 = "values();\n";
  }
  else {
    io::Printer::Print<>(pPVar19,"getStaticValuesArray();\n");
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar19,"private static $classname$[] getStaticValuesArray() {\n",
               (char (*) [10])0x2949ca,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                pEVar17->descriptor_);
    google::protobuf::io::Printer::Indent();
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar19,"return new $classname$[] {\n  ",(char (*) [10])0x2949ca,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                pEVar17->descriptor_);
    pEVar10 = pEVar17->descriptor_;
    if (0 < *(int *)(pEVar10 + 0x2c)) {
      lVar13 = 0;
      lVar8 = 0;
      do {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (local_48,"$name$, ",(char (*) [5])0x2d3a42,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(pEVar10 + 0x30) + lVar13));
        lVar8 = lVar8 + 1;
        pEVar10 = local_38->descriptor_;
        lVar13 = lVar13 + 0x28;
      } while (lVar8 < *(int *)(pEVar10 + 0x2c));
    }
    pPVar19 = local_48;
    io::Printer::Print<>(local_48,"\n};\n");
    pEVar17 = local_38;
    google::protobuf::io::Printer::Outdent();
    pcVar15 = "}";
  }
  io::Printer::Print<>(pPVar19,pcVar15);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar19,
             "\npublic static $classname$ valueOf(\n    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n  if (desc.getType() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"EnumValueDescriptor is not for this type.\");\n  }\n"
             ,(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              pEVar17->descriptor_);
  if (*(int *)(*(long *)(pEVar17->descriptor_ + 0x10) + 0x3c) == 3) {
    io::Printer::Print<>(pPVar19,"  if (desc.getIndex() == -1) {\n    return UNRECOGNIZED;\n  }\n");
  }
  io::Printer::Print<>(pPVar19,"  return VALUES[desc.getIndex()];\n}\n\n");
  if ((char)local_3c == '\0') {
    io::Printer::Print<>(pPVar19,"private final int index;\n");
  }
LAB_002061ec:
  io::Printer::Print<>(pPVar19,"private final int value;\n\n");
  if ((char)local_3c == '\0') {
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar19,"private $classname$(int index, int value) {\n",(char (*) [10])0x2949ca,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                pEVar17->descriptor_);
    if ((pEVar17->context_->options_).enforce_lite == false) {
      io::Printer::Print<>(pPVar19,"  this.index = index;\n");
    }
  }
  else {
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar19,"private $classname$(int value) {\n",(char (*) [10])0x2949ca,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                pEVar17->descriptor_);
  }
  io::Printer::Print<>(pPVar19,"  this.value = value;\n}\n");
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar19,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n",
             (char (*) [10])0x2932bf,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pEVar17->descriptor_ + 8));
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(pPVar19,"}\n\n");
  if (local_f0 != (undefined1  [8])&index_text._M_string_length) {
    operator_delete((void *)local_f0);
  }
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.ProtocolMessageEnum {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  bool ordinal_is_index = true;
  std::string index_text = "ordinal()";
  for (int i = 0; i < canonical_values_.size(); i++) {
    if (canonical_values_[i]->index() != i) {
      ordinal_is_index = false;
      index_text = "index";
      break;
    }
  }

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<std::string, std::string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["index"] = StrCat(canonical_values_[i]->index());
    vars["number"] = StrCat(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    if (ordinal_is_index) {
      printer->Print(vars, "$name$($number$),\n");
    } else {
      printer->Print(vars, "$name$($index$, $number$),\n");
    }
    printer->Annotate("name", canonical_values_[i]);
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print("${$UNRECOGNIZED$}$(-1),\n", "{", "", "}", "");
    } else {
      printer->Print("${$UNRECOGNIZED$}$(-1, -1),\n", "{", "", "}", "");
    }
    printer->Annotate("{", "}", descriptor_);
  }

  printer->Print(
      ";\n"
      "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<std::string, std::string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(
        vars, "public static final $classname$ $name$ = $canonical_name$;\n");
    printer->Annotate("name", aliases_[i].value);
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<std::string, std::string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = StrCat(descriptor_->value(i)->number());
    vars["{"] = "";
    vars["}"] = "";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated()
                              ? "@java.lang.Deprecated "
                              : "";
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
                   "$deprecation$public static final int ${$$name$_VALUE$}$ = "
                   "$number$;\n");
    printer->Annotate("{", "}", descriptor_->value(i));
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print(
          "  if (this == UNRECOGNIZED) {\n"
          "    throw new java.lang.IllegalArgumentException(\n"
          "        \"Can't get the number of an unknown enum value.\");\n"
          "  }\n");
    } else {
      printer->Print(
          "  if (index == -1) {\n"
          "    throw new java.lang.IllegalArgumentException(\n"
          "        \"Can't get the number of an unknown enum value.\");\n"
          "  }\n");
    }
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n"
      "/**\n"
      " * @param value The numeric wire value of the corresponding enum "
      "entry.\n"
      " * @return The enum associated with the given numeric wire value.\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $classname$ valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "/**\n"
      " * @param value The numeric wire value of the corresponding enum "
      "entry.\n"
      " * @return The enum associated with the given numeric wire value.\n"
      " */\n"
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print("case $number$: return $name$;\n", "name",
                   canonical_values_[i]->name(), "number",
                   StrCat(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
      "    internalGetValueMap() {\n"
      "  return internalValueMap;\n"
      "}\n"
      "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
      "    $classname$> internalValueMap =\n"
      "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
      "        public $classname$ findValueByNumber(int number) {\n"
      "          return $classname$.forNumber(number);\n"
      "        }\n"
      "      };\n"
      "\n",
      "classname", descriptor_->name());

  // -----------------------------------------------------------------
  // Reflection

  if (HasDescriptorMethods(descriptor_, context_->EnforceLite())) {
    printer->Print(
        "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n"
        "    getValueDescriptor() {\n");
    if (SupportUnknownEnumValue(descriptor_->file())) {
      if (ordinal_is_index) {
        printer->Print(
            "  if (this == UNRECOGNIZED) {\n"
            "    throw new java.lang.IllegalStateException(\n"
            "        \"Can't get the descriptor of an unrecognized enum "
            "value.\");\n"
            "  }\n");
      } else {
        printer->Print(
            "  if (index == -1) {\n"
            "    throw new java.lang.IllegalStateException(\n"
            "        \"Can't get the descriptor of an unrecognized enum "
            "value.\");\n"
            "  }\n");
      }
    }
    printer->Print(
        "  return getDescriptor().getValues().get($index_text$);\n"
        "}\n"
        "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
        "    getDescriptorForType() {\n"
        "  return getDescriptor();\n"
        "}\n"
        "public static final com.google.protobuf.Descriptors.EnumDescriptor\n"
        "    getDescriptor() {\n",
        "index_text", index_text);

    // TODO(kenton):  Cache statically?  Note that we can't access descriptors
    //   at module init time because it wouldn't work with descriptor.proto, but
    //   we can cache the value the first time getDescriptor() is called.
    if (descriptor_->containing_type() == NULL) {
      // The class generated for the File fully populates the descriptor with
      // extensions in both the mutable and immutable cases. (In the mutable api
      // this is accomplished by attempting to load the immutable outer class).
      printer->Print(
          "  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
          "file",
          name_resolver_->GetClassName(descriptor_->file(), immutable_api_),
          "index", StrCat(descriptor_->index()));
    } else {
      printer->Print(
          "  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
          "parent",
          name_resolver_->GetClassName(descriptor_->containing_type(),
                                       immutable_api_),
          "descriptor",
          descriptor_->containing_type()
                  ->options()
                  .no_standard_descriptor_accessor()
              ? "getDefaultInstance().getDescriptorForType()"
              : "getDescriptor()",
          "index", StrCat(descriptor_->index()));
    }

    printer->Print(
        "}\n"
        "\n"
        "private static final $classname$[] VALUES = ",
        "classname", descriptor_->name());

    if (CanUseEnumValues()) {
      // If the constants we are going to output are exactly the ones we
      // have declared in the Java enum in the same order, then we can use
      // the values() method that the Java compiler automatically generates
      // for every enum.
      printer->Print("values();\n");
    } else {
      printer->Print("getStaticValuesArray();\n");
      printer->Print("private static $classname$[] getStaticValuesArray() {\n",
                     "classname", descriptor_->name());
      printer->Indent();
      printer->Print(
          "return new $classname$[] {\n"
          "  ",
          "classname", descriptor_->name());
      for (int i = 0; i < descriptor_->value_count(); i++) {
        printer->Print("$name$, ", "name", descriptor_->value(i)->name());
      }
      printer->Print(
          "\n"
          "};\n");
      printer->Outdent();
      printer->Print("}");
    }

    printer->Print(
        "\n"
        "public static $classname$ valueOf(\n"
        "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n"
        "  if (desc.getType() != getDescriptor()) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "      \"EnumValueDescriptor is not for this type.\");\n"
        "  }\n",
        "classname", descriptor_->name());
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
          "  if (desc.getIndex() == -1) {\n"
          "    return UNRECOGNIZED;\n"
          "  }\n");
    }
    printer->Print(
        "  return VALUES[desc.getIndex()];\n"
        "}\n"
        "\n");

    if (!ordinal_is_index) {
      printer->Print("private final int index;\n");
    }
  }

  // -----------------------------------------------------------------

  printer->Print("private final int value;\n\n");

  if (ordinal_is_index) {
    printer->Print("private $classname$(int value) {\n", "classname",
                   descriptor_->name());
  } else {
    printer->Print("private $classname$(int index, int value) {\n", "classname",
                   descriptor_->name());
  }
  if (HasDescriptorMethods(descriptor_, context_->EnforceLite()) &&
      !ordinal_is_index) {
    printer->Print("  this.index = index;\n");
  }
  printer->Print(
      "  this.value = value;\n"
      "}\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}